

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Textures::DefaultsTest::CompareAndLog
          (DefaultsTest *this,GLfloat value_ref,GLfloat value_dst,GLenum pname)

{
  ostringstream *this_00;
  float fVar1;
  float fVar2;
  Enum<int,_2UL> local_1a8;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  fVar1 = value_ref - value_dst;
  fVar2 = -fVar1;
  if (-fVar1 <= fVar1) {
    fVar2 = fVar1;
  }
  if (0.0125 < fVar2) {
    local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Queried value of pname ",0x17);
    local_1a8.m_getName = glu::getTextureParameterName;
    local_1a8.m_value = pname;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1a8,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," is equal to ",0xd);
    std::ostream::_M_insert<double>((double)value_dst);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", however ",10);
    std::ostream::_M_insert<double>((double)value_ref);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," was expected. Test fails.",0x1a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_120);
  }
  return fVar2 <= 0.0125;
}

Assistant:

bool DefaultsTest::CompareAndLog(glw::GLfloat value_ref, glw::GLfloat value_dst, glw::GLenum pname)
{
	if (de::abs(value_ref - value_dst) > 0.0125 /* Precision */)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Queried value of pname "
											<< glu::getTextureParameterStr(pname) << " is equal to " << value_dst
											<< ", however " << value_ref << " was expected. Test fails."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}